

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O1

void Bac_ManWriteRange(Bac_Ntk_t *p,int Beg,int End)

{
  uint uVar1;
  int iVar2;
  Vec_Str_t *p_00;
  char *pcVar3;
  size_t sVar4;
  
  p_00 = p->pDesign->vOut;
  uVar1 = p_00->nCap;
  if (p_00->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(p_00->pArray,0x10);
      }
      sVar4 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if ((int)sVar4 <= (int)uVar1) goto LAB_0032642b;
      if (p_00->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar4);
      }
      else {
        pcVar3 = (char *)realloc(p_00->pArray,sVar4);
      }
    }
    p_00->pArray = pcVar3;
    p_00->nCap = (int)sVar4;
  }
LAB_0032642b:
  iVar2 = p_00->nSize;
  p_00->nSize = iVar2 + 1;
  p_00->pArray[iVar2] = '[';
  if (-1 < End) {
    Vec_StrPrintNum(p_00,End);
    uVar1 = p_00->nCap;
    if (p_00->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(0x10);
        }
        else {
          pcVar3 = (char *)realloc(p_00->pArray,0x10);
        }
        sVar4 = 0x10;
      }
      else {
        sVar4 = (ulong)uVar1 * 2;
        if ((int)sVar4 <= (int)uVar1) goto LAB_003264aa;
        if (p_00->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(sVar4);
        }
        else {
          pcVar3 = (char *)realloc(p_00->pArray,sVar4);
        }
      }
      p_00->pArray = pcVar3;
      p_00->nCap = (int)sVar4;
    }
LAB_003264aa:
    iVar2 = p_00->nSize;
    p_00->nSize = iVar2 + 1;
    p_00->pArray[iVar2] = ':';
  }
  Vec_StrPrintNum(p_00,Beg);
  uVar1 = p_00->nCap;
  if (p_00->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(p_00->pArray,0x10);
      }
      sVar4 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if ((int)sVar4 <= (int)uVar1) goto LAB_0032651f;
      if (p_00->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar4);
      }
      else {
        pcVar3 = (char *)realloc(p_00->pArray,sVar4);
      }
    }
    p_00->pArray = pcVar3;
    p_00->nCap = (int)sVar4;
  }
LAB_0032651f:
  iVar2 = p_00->nSize;
  p_00->nSize = iVar2 + 1;
  p_00->pArray[iVar2] = ']';
  return;
}

Assistant:

static inline void Bac_ManWriteRange( Bac_Ntk_t * p, int Beg, int End )
{
    Vec_Str_t * vStr = p->pDesign->vOut;
    Vec_StrPrintStr( vStr, "[" );
    if ( End >= 0 )
    {
        Vec_StrPrintNum( vStr, End );
        Vec_StrPrintStr( vStr, ":" );
    }
    Vec_StrPrintNum( vStr, Beg );
    Vec_StrPrintStr( vStr, "]" );
}